

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

bool absl::lts_20250127::container_internal::operator==(iterator *a,iterator *b)

{
  slot_type *ppEVar1;
  slot_type *ppEVar2;
  slot_type *ppEVar3;
  slot_type *ppEVar4;
  slot_type *ppEVar5;
  bool bVar6;
  slot_type *ppEVar7;
  
  ppEVar1 = (slot_type *)a->ctrl_;
  if ((ppEVar1 == (slot_type *)(kEmptyGroup + 0x10) || ppEVar1 == (slot_type *)0x0) ||
     (kSentinel < *(ctrl_t *)ppEVar1)) {
    ppEVar2 = (slot_type *)b->ctrl_;
    if ((ppEVar2 != (slot_type *)(kEmptyGroup + 0x10) && ppEVar2 != (slot_type *)0x0) &&
       (*(ctrl_t *)ppEVar2 < ~kSentinel)) goto LAB_00f2e8fc;
    if (ppEVar1 == (slot_type *)(kEmptyGroup + 0x10) && ppEVar2 == (slot_type *)(kEmptyGroup + 0x10)
       ) {
LAB_00f2e8ef:
      return ppEVar1 == ppEVar2;
    }
    if ((ppEVar1 == (slot_type *)(kEmptyGroup + 0x10)) ==
        (ppEVar2 == (slot_type *)(kEmptyGroup + 0x10))) {
      if (ppEVar1 == (slot_type *)0x0 || ppEVar2 == (slot_type *)0x0) goto LAB_00f2e8ef;
      if ((ppEVar2 == (slot_type *)kSooControl) == (ppEVar1 == (slot_type *)kSooControl)) {
        ppEVar3 = (a->field_1).slot_;
        ppEVar4 = (b->field_1).slot_;
        if (ppEVar1 == (slot_type *)kSooControl) {
          bVar6 = ppEVar3 == ppEVar4;
        }
        else {
          ppEVar7 = ppEVar4;
          ppEVar5 = ppEVar2;
          if (ppEVar2 < ppEVar1) {
            ppEVar7 = ppEVar3;
            ppEVar5 = ppEVar1;
            ppEVar3 = ppEVar4;
          }
          bVar6 = ppEVar3 <= ppEVar7 && ppEVar5 < ppEVar3;
        }
        if (bVar6) goto LAB_00f2e8ef;
      }
      goto LAB_00f2e906;
    }
  }
  else {
    operator==();
LAB_00f2e8fc:
    operator==();
  }
  operator==();
LAB_00f2e906:
  operator==();
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }